

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O2

__m256i * compute_p(__m256i *__return_storage_ptr__,__m256i sum1,__m256i sum2,int bit_depth,int n)

{
  uint uVar1;
  __m256i *in_RAX;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  iVar3 = (int)__return_storage_ptr__;
  auVar5 = in_ZMM0._0_32_;
  if (iVar3 < 9) {
    auVar5 = vpmaddwd_avx2(auVar5,auVar5);
    auVar8._4_4_ = bit_depth;
    auVar8._0_4_ = bit_depth;
    auVar8._8_4_ = bit_depth;
    auVar8._12_4_ = bit_depth;
    auVar8._16_4_ = bit_depth;
    auVar8._20_4_ = bit_depth;
    auVar8._24_4_ = bit_depth;
    auVar8._28_4_ = bit_depth;
    auVar8 = vpmulld_avx2(auVar8,in_ZMM1._0_32_);
  }
  else {
    uVar2 = iVar3 * 2 - 0x10;
    uVar1 = iVar3 - 8;
    in_RAX = (__m256i *)(ulong)uVar1;
    uVar4 = (uint)(1 << ((byte)uVar2 & 0x1f)) >> 1;
    auVar6._4_4_ = uVar4;
    auVar6._0_4_ = uVar4;
    auVar6._8_4_ = uVar4;
    auVar6._12_4_ = uVar4;
    auVar6._16_4_ = uVar4;
    auVar6._20_4_ = uVar4;
    auVar6._24_4_ = uVar4;
    auVar6._28_4_ = uVar4;
    iVar3 = (1 << ((byte)uVar1 & 0x1f)) >> 1;
    auVar9._4_4_ = iVar3;
    auVar9._0_4_ = iVar3;
    auVar9._8_4_ = iVar3;
    auVar9._12_4_ = iVar3;
    auVar9._16_4_ = iVar3;
    auVar9._20_4_ = iVar3;
    auVar9._24_4_ = iVar3;
    auVar9._28_4_ = iVar3;
    auVar8 = vpaddd_avx2(auVar6,in_ZMM1._0_32_);
    auVar8 = vpsrld_avx2(auVar8,ZEXT416(uVar2));
    auVar5 = vpaddd_avx2(auVar9,auVar5);
    auVar5 = vpsrld_avx2(auVar5,ZEXT416(uVar1));
    auVar5 = vpmaddwd_avx2(auVar5,auVar5);
    auVar7._4_4_ = bit_depth;
    auVar7._0_4_ = bit_depth;
    auVar7._8_4_ = bit_depth;
    auVar7._12_4_ = bit_depth;
    auVar7._16_4_ = bit_depth;
    auVar7._20_4_ = bit_depth;
    auVar7._24_4_ = bit_depth;
    auVar7._28_4_ = bit_depth;
    auVar8 = vpmulld_avx2(auVar8,auVar7);
    auVar8 = vpmaxsd_avx2(auVar8,auVar5);
  }
  vpsubd_avx2(auVar8,auVar5);
  return in_RAX;
}

Assistant:

static __m256i compute_p(__m256i sum1, __m256i sum2, int bit_depth, int n) {
  __m256i an, bb;
  if (bit_depth > 8) {
    const __m256i rounding_a = round_for_shift(2 * (bit_depth - 8));
    const __m256i rounding_b = round_for_shift(bit_depth - 8);
    const __m128i shift_a = _mm_cvtsi32_si128(2 * (bit_depth - 8));
    const __m128i shift_b = _mm_cvtsi32_si128(bit_depth - 8);
    const __m256i a =
        _mm256_srl_epi32(_mm256_add_epi32(sum2, rounding_a), shift_a);
    const __m256i b =
        _mm256_srl_epi32(_mm256_add_epi32(sum1, rounding_b), shift_b);
    // b < 2^14, so we can use a 16-bit madd rather than a 32-bit
    // mullo to square it
    bb = _mm256_madd_epi16(b, b);
    an = _mm256_max_epi32(_mm256_mullo_epi32(a, _mm256_set1_epi32(n)), bb);
  } else {
    bb = _mm256_madd_epi16(sum1, sum1);
    an = _mm256_mullo_epi32(sum2, _mm256_set1_epi32(n));
  }
  return _mm256_sub_epi32(an, bb);
}